

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void __thiscall
matchit::impl::Id<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>::Id
          (Id<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *this,
          Id<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *id)

{
  BlockT *local_78;
  variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
  local_70;
  IdBlockBase<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> local_40;
  Id<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *local_18;
  Id<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *id_local;
  Id<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *this_local;
  
  local_18 = id;
  id_local = this;
  IdBlockBase<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>::IdBlockBase(&local_40);
  std::
  variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*>
  ::
  variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,void,void,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,void>
            ((variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*>
              *)this,(IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *)
                     &local_40);
  IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>::~IdBlock
            ((IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *)&local_40);
  local_78 = block(local_18);
  std::
  variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*>
  ::
  variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*,void,void,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*,void>
            ((variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*>
              *)&local_70,&local_78);
  std::
  variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
  ::operator=(&this->mBlock,&local_70);
  std::
  variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
  ::~variant(&local_70);
  return;
}

Assistant:

constexpr Id(Id const &id) { mBlock = BlockVT{&id.block()}; }